

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
 notch::core::Init::newRNG(void)

{
  undefined4 uVar1;
  size_t __i;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  ulong uVar2;
  pointer *__ptr;
  __uniq_ptr_data<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>,_true,_true>
  in_RDI;
  long lVar3;
  seed_seq sseq;
  array<unsigned_int,_624UL> seed_data;
  random_device rd;
  seed_seq local_1d80;
  uint local_1d68 [624];
  random_device local_13a8;
  
  std::random_device::random_device(&local_13a8);
  lVar3 = 0;
  do {
    uVar1 = ::std::random_device::_M_getval();
    *(undefined4 *)((long)local_1d68 + lVar3) = uVar1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x9c0);
  ::std::seed_seq::seed_seq<unsigned_int*>(&local_1d80,local_1d68,(uint *)&local_13a8);
  this = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)operator_new(5000);
  this->_M_x[0] = 0x1571;
  lVar3 = 1;
  uVar2 = 0x1571;
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    this->_M_x[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  this->_M_p = 0x270;
  *(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    **)in_RDI.
       super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
       .
       super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
       ._M_head_impl = this;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed<std::seed_seq>(this,&local_1d80);
  if (local_1d80._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d80._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::random_device::_M_fini();
  return (__uniq_ptr_data<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>,_true,_true>
          )(tuple<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
            )in_RDI.
             super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
             .
             super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
             ._M_head_impl;
}

Assistant:

static std::unique_ptr<RNG> newRNG() {
        std::random_device rd;
        std::array<uint32_t, std::mt19937::state_size> seed_data;
        std::generate(seed_data.begin(), seed_data.end(), ref(rd));
        std::seed_seq sseq(std::begin(seed_data), std::end(seed_data));
        std::unique_ptr<RNG> rng(new RNG());
        rng->seed(sseq);
        return rng;
    }